

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  hdr_histogram *phVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  size_t base64_len;
  size_t encoded_size;
  size_t __nmemb;
  uint8_t *output;
  char *pcVar6;
  char *pcVar7;
  hdr_histogram *hdr_new;
  hdr_histogram *histogram;
  char *data;
  hdr_histogram *local_50;
  hdr_histogram *local_48;
  hdr_histogram *local_40;
  size_t local_38;
  
  tests_run = 0;
  local_50 = (hdr_histogram *)0x0;
  hdr_alloc(3600000000,3,&local_48);
  iVar4 = hdr_log_encode(local_48,(char **)&local_40);
  phVar2 = local_40;
  if (iVar4 == 0) {
    base64_len = strlen((char *)local_40);
    iVar4 = hdr_log_decode(&local_50,(char *)phVar2,base64_len);
    if (iVar4 != 0) {
      pcVar7 = "Failed to decode histogram data";
      goto LAB_001014e7;
    }
    _Var3 = compare_histogram(local_48,local_50);
    if (!_Var3) {
      pcVar7 = "Histograms should be the same";
      goto LAB_001014e7;
    }
    free(local_48);
    free(local_50);
    free(local_40);
    bVar1 = true;
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = "Failed to encode histogram data";
LAB_001014e7:
    bVar1 = false;
  }
  tests_run = tests_run + 1;
  if (!bVar1) {
    pcVar6 = "test_encode_decode_empty";
    goto LAB_00101c41;
  }
  local_40 = (hdr_histogram *)0x0;
  local_48 = (hdr_histogram *)0x0;
  local_50 = (hdr_histogram *)0x0;
  load_histograms();
  phVar2 = raw_histogram;
  iVar4 = hdr_encode_compressed(raw_histogram,(uint8_t **)&local_40,(size_t *)&local_48);
  if (iVar4 == 0) {
    iVar4 = hdr_decode_compressed((uint8_t *)local_40,(size_t)local_48,&local_50);
    if (iVar4 != 0) {
      pcVar7 = hdr_strerror(iVar4);
      puts(pcVar7);
      pcVar7 = "Did not decode";
      goto LAB_0010157f;
    }
    bVar1 = true;
    if (local_50 == (hdr_histogram *)0x0) {
      pcVar7 = "Loaded histogram is null";
    }
    else {
      _Var3 = compare_histogram(phVar2,local_50);
      if (_Var3) {
        free(local_50);
        bVar1 = false;
        pcVar7 = (char *)0x0;
      }
      else {
        pcVar7 = "Comparison did not match";
      }
    }
  }
  else {
    pcVar7 = hdr_strerror(iVar4);
    puts(pcVar7);
    pcVar7 = "Did not encode";
LAB_0010157f:
    bVar1 = true;
  }
  tests_run = tests_run + 1;
  pcVar6 = "test_encode_decode_empty";
  if (bVar1) {
    pcVar6 = "test_encode_and_decode_compressed";
    goto LAB_00101c41;
  }
  local_40 = (hdr_histogram *)0x0;
  local_48 = (hdr_histogram *)0x0;
  local_50 = (hdr_histogram *)0x0;
  load_histograms();
  phVar2 = cor_histogram;
  iVar4 = hdr_encode_compressed(cor_histogram,(uint8_t **)&local_40,(size_t *)&local_48);
  if (iVar4 == 0) {
    iVar4 = hdr_decode_compressed((uint8_t *)local_40,(size_t)local_48,&local_50);
    if (iVar4 != 0) {
      pcVar7 = hdr_strerror(iVar4);
      puts(pcVar7);
      pcVar7 = "Did not decode";
      goto LAB_00101628;
    }
    bVar1 = true;
    if (local_50 == (hdr_histogram *)0x0) {
      pcVar7 = "Loaded histogram is null";
    }
    else {
      _Var3 = compare_histogram(phVar2,local_50);
      if (_Var3) {
        free(local_50);
        bVar1 = false;
        pcVar7 = (char *)0x0;
      }
      else {
        pcVar7 = "Comparison did not match";
      }
    }
  }
  else {
    pcVar7 = hdr_strerror(iVar4);
    puts(pcVar7);
    pcVar7 = "Did not encode";
LAB_00101628:
    bVar1 = true;
  }
  tests_run = tests_run + 1;
  if (bVar1) {
    pcVar6 = "test_encode_and_decode_compressed2";
    goto LAB_00101c41;
  }
  local_40 = (hdr_histogram *)0x0;
  local_48 = (hdr_histogram *)0x0;
  local_50 = (hdr_histogram *)0x0;
  local_38 = 0;
  hdr_init(1,3600000000,4,&local_48);
  srand(5);
  iVar4 = 0x1f86;
  do {
    phVar2 = local_48;
    iVar5 = rand();
    hdr_record_value(phVar2,(long)iVar5);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  iVar4 = hdr_encode_compressed(local_48,(uint8_t **)&local_50,&local_38);
  if (iVar4 == 0) {
    iVar4 = hdr_decode_compressed((uint8_t *)local_50,local_38,&local_40);
    if (iVar4 != 0) {
      pcVar7 = hdr_strerror(iVar4);
      puts(pcVar7);
      pcVar7 = "Did not decode";
      goto LAB_00101735;
    }
    bVar1 = true;
    if (local_40 == (hdr_histogram *)0x0) {
      pcVar7 = "Loaded histogram is null";
    }
    else {
      _Var3 = compare_histogram(local_48,local_40);
      if (_Var3) {
        free(local_48);
        free(local_40);
        bVar1 = false;
        pcVar7 = (char *)0x0;
      }
      else {
        pcVar7 = "Comparison did not match";
      }
    }
  }
  else {
    pcVar7 = hdr_strerror(iVar4);
    puts(pcVar7);
    pcVar7 = "Did not encode";
LAB_00101735:
    bVar1 = true;
  }
  tests_run = tests_run + 1;
  if (bVar1) {
    pcVar6 = "test_encode_and_decode_compressed_large";
  }
  else {
    local_40 = (hdr_histogram *)0x0;
    local_48 = (hdr_histogram *)0x0;
    load_histograms();
    iVar4 = hdr_encode_compressed(cor_histogram,(uint8_t **)&local_40,(size_t *)&local_48);
    if (iVar4 == 0) {
      encoded_size = hdr_base64_encoded_len((size_t)local_48);
      __nmemb = hdr_base64_decoded_len(encoded_size);
      pcVar7 = (char *)calloc(encoded_size + 1,1);
      output = (uint8_t *)calloc(__nmemb,1);
      hdr_base64_encode((uint8_t *)local_40,(size_t)local_48,pcVar7,encoded_size);
      hdr_base64_decode(pcVar7,encoded_size,output,__nmemb);
      iVar4 = bcmp(local_40,output,(size_t)local_48);
      pcVar7 = (char *)0x0;
      if (iVar4 != 0) {
        pcVar7 = "Should be same";
      }
    }
    else {
      pcVar7 = hdr_strerror(iVar4);
      puts(pcVar7);
      pcVar7 = "Did not encode";
    }
    tests_run = tests_run + 1;
    if (pcVar7 == (char *)0x0) {
      local_40 = (hdr_histogram *)0x0;
      local_48 = (hdr_histogram *)0x0;
      local_50 = (hdr_histogram *)0x0;
      load_histograms();
      iVar4 = hdr_encode_compressed(cor_histogram,(uint8_t **)&local_40,(size_t *)&local_48);
      if (iVar4 == 0) {
        iVar4 = hdr_decode_compressed
                          ((uint8_t *)local_40,(size_t)((long)&local_48[-1].counts + 7),&local_50);
        _Var3 = compare_int64(0x16,(long)iVar4);
        if (_Var3) {
          pcVar7 = "Should not have built histogram";
          if (local_50 == (hdr_histogram *)0x0) {
            pcVar7 = (char *)0x0;
          }
        }
        else {
          pcVar7 = "Should have be invalid";
        }
      }
      else {
        pcVar7 = hdr_strerror(iVar4);
        puts(pcVar7);
        pcVar7 = "Did not encode";
      }
      tests_run = tests_run + 1;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = base64_decode_block_decodes_4_chars();
        tests_run = tests_run + 1;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = base64_decode_fails_with_invalid_lengths();
          tests_run = tests_run + 1;
          if (pcVar7 == (char *)0x0) {
            _Var3 = assert_base64_decode("YW55IGNhcm5hbCBwbGVhc3Vy","any carnal pleasur");
            tests_run = tests_run + 1;
            if (!_Var3) {
              pcVar6 = "base64_decode_decodes_strings_without_padding";
            }
            if (_Var3) {
              pcVar7 = base64_decode_decodes_strings_with_padding();
              tests_run = tests_run + 1;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = base64_encode_block_encodes_3_bytes();
                tests_run = tests_run + 1;
                pcVar6 = "base64_encode_block_encodes_3_bytes";
                if (pcVar7 == (char *)0x0) {
                  iVar4 = hdr_base64_encode((uint8_t *)0x0,9,(char *)0x0,0xb);
                  tests_run = tests_run + 1;
                  if (iVar4 == 0) {
                    pcVar6 = "base64_encode_fails_with_invalid_lengths";
                    pcVar7 = "Output length not 4/3 of input length";
                  }
                  else {
                    _Var3 = assert_base64_encode("any carnal pleasur","YW55IGNhcm5hbCBwbGVhc3Vy");
                    tests_run = tests_run + 1;
                    pcVar6 = "base64_encode_encodes_without_padding";
                    pcVar7 = "Encoding without padding";
                    if (_Var3) {
                      pcVar7 = base64_encode_encodes_with_padding();
                      tests_run = tests_run + 1;
                      if (pcVar7 == (char *)0x0) {
                        pcVar7 = writes_and_reads_log();
                        tests_run = tests_run + 1;
                        if (pcVar7 == (char *)0x0) {
                          pcVar7 = log_reader_aggregates_into_single_histogram();
                          tests_run = tests_run + 1;
                          if (pcVar7 == (char *)0x0) {
                            pcVar7 = log_reader_fails_with_incorrect_version();
                            tests_run = tests_run + 1;
                            if (pcVar7 == (char *)0x0) {
                              pcVar7 = test_string_encode_decode();
                              tests_run = tests_run + 1;
                              if (pcVar7 == (char *)0x0) {
                                pcVar7 = test_string_encode_decode_2();
                                tests_run = tests_run + 1;
                                if (pcVar7 == (char *)0x0) {
                                  pcVar7 = decode_v3_log();
                                  tests_run = tests_run + 1;
                                  if (pcVar7 == (char *)0x0) {
                                    pcVar7 = decode_v2_log();
                                    tests_run = tests_run + 1;
                                    if (pcVar7 == (char *)0x0) {
                                      pcVar7 = decode_v1_log();
                                      tests_run = tests_run + 1;
                                      if (pcVar7 == (char *)0x0) {
                                        pcVar7 = decode_v0_log();
                                        tests_run = tests_run + 1;
                                        if (pcVar7 == (char *)0x0) {
                                          pcVar7 = handle_invalid_log_lines();
                                          tests_run = tests_run + 1;
                                          if (pcVar7 == (char *)0x0) {
                                            pcVar7 = test_encode_and_decode_empty();
                                            tests_run = tests_run + 1;
                                            if (pcVar7 == (char *)0x0) {
                                              free(raw_histogram);
                                              free(cor_histogram);
                                              pcVar6 = (char *)0x0;
                                              pcVar7 = (char *)0x0;
                                            }
                                            else {
                                              pcVar6 = "test_encode_and_decode_empty";
                                            }
                                          }
                                          else {
                                            pcVar6 = "handle_invalid_log_lines";
                                          }
                                        }
                                        else {
                                          pcVar6 = "decode_v0_log";
                                        }
                                      }
                                      else {
                                        pcVar6 = "decode_v1_log";
                                      }
                                    }
                                    else {
                                      pcVar6 = "decode_v2_log";
                                    }
                                  }
                                  else {
                                    pcVar6 = "decode_v3_log";
                                  }
                                }
                                else {
                                  pcVar6 = "test_string_encode_decode_2";
                                }
                              }
                              else {
                                pcVar6 = "test_string_encode_decode";
                              }
                            }
                            else {
                              pcVar6 = "log_reader_fails_with_incorrect_version";
                            }
                          }
                          else {
                            pcVar6 = "log_reader_aggregates_into_single_histogram";
                          }
                        }
                        else {
                          pcVar6 = "writes_and_reads_log";
                        }
                      }
                      else {
                        pcVar6 = "base64_encode_encodes_with_padding";
                      }
                    }
                  }
                }
              }
              else {
                pcVar6 = "base64_decode_decodes_strings_with_padding";
              }
            }
            else {
              pcVar7 = "Encoding without padding";
            }
          }
          else {
            pcVar6 = "base64_decode_fails_with_invalid_lengths";
          }
        }
        else {
          pcVar6 = "base64_decode_block_decodes_4_chars";
        }
      }
      else {
        pcVar6 = "test_bounds_check_on_decode";
      }
    }
    else {
      pcVar6 = "test_encode_and_decode_base64";
    }
  }
LAB_00101c41:
  if (pcVar7 == (char *)0x0) {
    puts("ALL TESTS PASSED");
  }
  else {
    printf("hdr_histogram_log_test.%s(): %s\n",pcVar6,pcVar7);
  }
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return -(uint)(pcVar7 != (char *)0x0);
}

Assistant:

static struct mu_result all_tests(void)
{
    tests_run = 0;

    mu_run_test(test_encode_decode_empty);
    mu_run_test(test_encode_and_decode_compressed);
    mu_run_test(test_encode_and_decode_compressed2);
    mu_run_test(test_encode_and_decode_compressed_large);
    mu_run_test(test_encode_and_decode_base64);
    mu_run_test(test_bounds_check_on_decode);

    mu_run_test(base64_decode_block_decodes_4_chars);
    mu_run_test(base64_decode_fails_with_invalid_lengths);
    mu_run_test(base64_decode_decodes_strings_without_padding);
    mu_run_test(base64_decode_decodes_strings_with_padding);

    mu_run_test(base64_encode_block_encodes_3_bytes);
    mu_run_test(base64_encode_fails_with_invalid_lengths);
    mu_run_test(base64_encode_encodes_without_padding);
    mu_run_test(base64_encode_encodes_with_padding);

    mu_run_test(writes_and_reads_log);
    mu_run_test(log_reader_aggregates_into_single_histogram);
    mu_run_test(log_reader_fails_with_incorrect_version);

    mu_run_test(test_string_encode_decode);
    mu_run_test(test_string_encode_decode_2);

    mu_run_test(decode_v3_log);
    mu_run_test(decode_v2_log);
    mu_run_test(decode_v1_log);
    mu_run_test(decode_v0_log);
    mu_run_test(handle_invalid_log_lines);

    mu_run_test(test_encode_and_decode_empty);

    free(raw_histogram);
    free(cor_histogram);

    mu_ok;
}